

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O0

path * __thiscall FlatFileSeq::FileName(FlatFileSeq *this,FlatFilePos *pos)

{
  long lVar1;
  string *in_RDX;
  char *in_RSI;
  path *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  path *p1;
  int *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  fs::path::path((path *)in_stack_ffffffffffffff38,(path *)0xf3602f);
  tinyformat::format<char_const*,int>(in_RSI,(char **)in_RDX,in_stack_ffffffffffffff68);
  fs::u8path(in_RDX);
  fs::operator/(p1,in_RDI);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(in_stack_ffffffffffffff38);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return p1;
  }
  __stack_chk_fail();
}

Assistant:

fs::path FlatFileSeq::FileName(const FlatFilePos& pos) const
{
    return m_dir / fs::u8path(strprintf("%s%05u.dat", m_prefix, pos.nFile));
}